

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O0

bool __thiscall
ExternalSigner::SignTransaction
          (ExternalSigner *this,PartiallySignedTransaction *psbtx,string *error)

{
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> __last;
  string_view str;
  string_view str_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view hex_str;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  UniValue *base64_tx;
  UniValue *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_e2613762_for__M_pred matches_signer_fingerprint;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_m_fingerprint;
  DataStream ssTx;
  string signer_psbt_error;
  PartiallySignedTransaction signer_psbtx;
  UniValue signer_result;
  string stdinStr;
  string command;
  PartiallySignedTransaction *in_stack_fffffffffffffb68;
  PartiallySignedTransaction *in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  anon_class_8_1_e2613762_for__M_pred in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
  in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  DataStream *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined8 *puVar4;
  char *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  bool local_3b1;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  puVar4 = &local_348;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffb68);
  DataStream::operator<<
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
             in_stack_fffffffffffffb70);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb88.parsed_m_fingerprint);
  hex_str._M_str = in_stack_fffffffffffffbd8;
  hex_str._M_len = (size_t)puVar4;
  ParseHex<unsigned_char>(hex_str);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::begin
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffb70);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::end
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffb70);
  __last._M_current._7_1_ = in_stack_fffffffffffffb97;
  __last._M_current._0_7_ = in_stack_fffffffffffffb90;
  uVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<PSBTInput*,std::vector<PSBTInput,std::allocator<PSBTInput>>>,ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                    (in_stack_fffffffffffffb98,__last,in_stack_fffffffffffffb88);
  if ((bool)uVar1) {
    std::operator+(in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98._M_current);
    std::operator+(in_stack_fffffffffffffb80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb7f,
                            CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
    NetworkArg_abi_cxx11_((ExternalSigner *)in_stack_fffffffffffffb70);
    std::operator+(in_stack_fffffffffffffba0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb98._M_current);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    DataStream::str_abi_cxx11_(in_stack_fffffffffffffbb8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb88.parsed_m_fingerprint);
    str_00._M_len._7_1_ = in_stack_fffffffffffffb97;
    str_00._M_len._0_7_ = in_stack_fffffffffffffb90;
    str_00._M_str = (char *)in_stack_fffffffffffffb98._M_current;
    EncodeBase64_abi_cxx11_(str_00);
    std::operator+((char *)in_stack_fffffffffffffb80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb7f,
                            CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    RunCommandParseJSON(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb88.parsed_m_fingerprint,(char *)in_stack_fffffffffffffb80);
    key._M_len._7_1_ = in_stack_fffffffffffffbb7;
    key._M_len._0_7_ = in_stack_fffffffffffffbb0;
    key._M_str = (char *)in_stack_fffffffffffffbb8;
    base64_tx = UniValue::find_value
                          ((UniValue *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90)
                           ,key);
    uVar2 = UniValue::isStr((UniValue *)in_stack_fffffffffffffb68);
    if ((bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffb88.parsed_m_fingerprint,(char *)in_stack_fffffffffffffb80);
      key_00._M_len._7_1_ = uVar2;
      key_00._M_len._0_7_ = in_stack_fffffffffffffbb0;
      key_00._M_str = (char *)base64_tx;
      UniValue::find_value
                ((UniValue *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),key_00);
      UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffffb70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb7f,
                          CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb70);
      local_3b1 = false;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffb88.parsed_m_fingerprint,(char *)in_stack_fffffffffffffb80);
      key_01._M_len._7_1_ = uVar2;
      key_01._M_len._0_7_ = in_stack_fffffffffffffbb0;
      key_01._M_str = (char *)base64_tx;
      fmt = UniValue::find_value
                      ((UniValue *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                       key_01);
      uVar3 = UniValue::isStr((UniValue *)in_stack_fffffffffffffb68);
      if ((bool)uVar3) {
        PartiallySignedTransaction::PartiallySignedTransaction(in_stack_fffffffffffffb68);
        std::__cxx11::string::string(in_stack_fffffffffffffb80);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffb88.parsed_m_fingerprint,(char *)in_stack_fffffffffffffb80)
        ;
        key_02._M_len._7_1_ = uVar2;
        key_02._M_len._0_7_ = in_stack_fffffffffffffbb0;
        key_02._M_str = (char *)base64_tx;
        UniValue::find_value((UniValue *)CONCAT17(uVar3,in_stack_fffffffffffffb90),key_02);
        UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffffb70);
        local_3b1 = DecodeBase64PSBT((PartiallySignedTransaction *)
                                     CONCAT17(uVar1,in_stack_fffffffffffffbc0),(string *)base64_tx,
                                     (string *)CONCAT17(uVar2,in_stack_fffffffffffffbb0));
        in_stack_fffffffffffffb7f = local_3b1;
        if (local_3b1) {
          PartiallySignedTransaction::operator=
                    ((PartiallySignedTransaction *)
                     CONCAT17(local_3b1,
                              CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                     in_stack_fffffffffffffb70);
        }
        else {
          tinyformat::format<std::__cxx11::string>
                    ((char *)fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_fffffffffffffb90));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,in_stack_fffffffffffffbc0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb68);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb68);
        PartiallySignedTransaction::~PartiallySignedTransaction(in_stack_fffffffffffffb68);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb7f,
                            CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                   (char *)in_stack_fffffffffffffb70);
        local_3b1 = false;
      }
    }
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
  }
  else {
    std::operator+((char *)in_stack_fffffffffffffbb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
    std::operator+(in_stack_fffffffffffffb80,
                   (char *)CONCAT17(in_stack_fffffffffffffb7f,
                                    CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
    DataStream::str_abi_cxx11_(in_stack_fffffffffffffbb8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb88.parsed_m_fingerprint);
    str._M_len._7_1_ = in_stack_fffffffffffffb97;
    str._M_len._0_7_ = in_stack_fffffffffffffb90;
    str._M_str = (char *)in_stack_fffffffffffffb98._M_current;
    EncodeBase64_abi_cxx11_(str);
    std::operator+(in_stack_fffffffffffffba0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb98._M_current);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(uVar1,in_stack_fffffffffffffbc0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    local_3b1 = false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffb68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3b1;
  }
  __stack_chk_fail();
}

Assistant:

bool ExternalSigner::SignTransaction(PartiallySignedTransaction& psbtx, std::string& error)
{
    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;
    // parse ExternalSigner master fingerprint
    std::vector<unsigned char> parsed_m_fingerprint = ParseHex(m_fingerprint);
    // Check if signer fingerprint matches any input master key fingerprint
    auto matches_signer_fingerprint = [&](const PSBTInput& input) {
        for (const auto& entry : input.hd_keypaths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.fingerprint)) return true;
        }
        for (const auto& entry : input.m_tap_bip32_paths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.second.fingerprint)) return true;
        }
        return false;
    };

    if (!std::any_of(psbtx.inputs.begin(), psbtx.inputs.end(), matches_signer_fingerprint)) {
        error = "Signer fingerprint " + m_fingerprint + " does not match any of the inputs:\n" + EncodeBase64(ssTx.str());
        return false;
    }

    const std::string command = m_command + " --stdin --fingerprint " + m_fingerprint + NetworkArg();
    const std::string stdinStr = "signtx " + EncodeBase64(ssTx.str());

    const UniValue signer_result = RunCommandParseJSON(command, stdinStr);

    if (signer_result.find_value("error").isStr()) {
        error = signer_result.find_value("error").get_str();
        return false;
    }

    if (!signer_result.find_value("psbt").isStr()) {
        error = "Unexpected result from signer";
        return false;
    }

    PartiallySignedTransaction signer_psbtx;
    std::string signer_psbt_error;
    if (!DecodeBase64PSBT(signer_psbtx, signer_result.find_value("psbt").get_str(), signer_psbt_error)) {
        error = strprintf("TX decode failed %s", signer_psbt_error);
        return false;
    }

    psbtx = signer_psbtx;

    return true;
}